

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O1

void __thiscall
vkt::sparse::anon_unknown_0::SparseBufferTestInstance::~SparseBufferTestInstance
          (SparseBufferTestInstance *this)

{
  Allocation *pAVar1;
  VkBuffer obj;
  Allocator *pAVar2;
  VkDevice pVVar3;
  
  (this->super_SparseResourcesBaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__SparseBufferTestInstance_00d62e38;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__SparseBufferTestInstance_00d62e60;
  pAVar1 = (this->m_colorBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_colorBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr = (Allocation *)0x0;
  }
  obj.m_internal =
       (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
  }
  (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->super_SparseResourcesBaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__SparseResourcesBaseInstance_00d631c0;
  pAVar2 = (this->super_SparseResourcesBaseInstance).m_allocator.
           super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  if (pAVar2 != (Allocator *)0x0) {
    (*pAVar2->_vptr_Allocator[1])();
    (this->super_SparseResourcesBaseInstance).m_allocator.
    super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr =
         (Allocator *)0x0;
  }
  pVVar3 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
           .m_data.object;
  if (pVVar3 != (VkDevice)0x0) {
    (*(this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
      m_data.deleter.m_destroyDevice)
              (pVVar3,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  object = (VkDevice_s *)0x0;
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
  deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
            (&(this->super_SparseResourcesBaseInstance).m_deviceDriver.
              super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
  ::~_Rb_tree(&(this->super_SparseResourcesBaseInstance).m_queues._M_t);
  return;
}

Assistant:

SparseBufferTestInstance (Context& context, const TestFlags flags)
		: SparseResourcesBaseInstance	(context)
		, m_aliased						((flags & TEST_FLAG_ALIASED)   != 0)
		, m_residency					((flags & TEST_FLAG_RESIDENCY) != 0)
		, m_nonResidentStrict			((flags & TEST_FLAG_NON_RESIDENT_STRICT) != 0)
		, m_renderSize					(RENDER_SIZE, RENDER_SIZE)
		, m_colorFormat					(VK_FORMAT_R8G8B8A8_UNORM)
		, m_colorBufferSize				(m_renderSize.x() * m_renderSize.y() * tcu::getPixelSize(mapVkFormat(m_colorFormat)))
	{
		const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice());

		if (!features.sparseBinding)
			TCU_THROW(NotSupportedError, "Missing feature: sparseBinding");

		if (m_residency && !features.sparseResidencyBuffer)
			TCU_THROW(NotSupportedError, "Missing feature: sparseResidencyBuffer");

		if (m_aliased && !features.sparseResidencyAliased)
			TCU_THROW(NotSupportedError, "Missing feature: sparseResidencyAliased");

		if (m_nonResidentStrict && !m_context.getDeviceProperties().sparseProperties.residencyNonResidentStrict)
			TCU_THROW(NotSupportedError, "Missing sparse property: residencyNonResidentStrict");

		{
			QueueRequirementsVec requirements;
			requirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
			requirements.push_back(QueueRequirements(VK_QUEUE_GRAPHICS_BIT | VK_QUEUE_COMPUTE_BIT, 1u));

			createDeviceSupportingQueues(requirements);
		}

		const DeviceInterface& vk		= getDeviceInterface();
		m_sparseQueue					= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0u);
		m_universalQueue				= getQueue(VK_QUEUE_GRAPHICS_BIT | VK_QUEUE_COMPUTE_BIT, 0u);

		m_sharedQueueFamilyIndices[0]	= m_sparseQueue.queueFamilyIndex;
		m_sharedQueueFamilyIndices[1]	= m_universalQueue.queueFamilyIndex;

		m_colorBuffer					= makeBuffer(vk, getDevice(), makeBufferCreateInfo(m_colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
		m_colorBufferAlloc				= bindBuffer(vk, getDevice(), getAllocator(), *m_colorBuffer, MemoryRequirement::HostVisible);

		deMemset(m_colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(m_colorBufferSize));
		flushMappedMemoryRange(vk, getDevice(), m_colorBufferAlloc->getMemory(), m_colorBufferAlloc->getOffset(), m_colorBufferSize);
	}